

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
SummizerTestGlobal2_CanSumGlobal2_Test::TestBody(SummizerTestGlobal2_CanSumGlobal2_Test *this)

{
  bool bVar1;
  int iVar2;
  gmock_globalmock_sum2 *pgVar3;
  type pgVar4;
  MockSpec<int_(int,_int)> *pMVar5;
  TypedExpectation<int_(int,_int)> *pTVar6;
  pointer pgVar7;
  WithoutMatchers local_109;
  Matcher<int> local_108;
  Matcher<int> local_f0;
  MockSpec<int_(int,_int)> local_d8;
  GlobalMockDeleter<gmock_globalmock_sum2> local_a0;
  GlobalMockDeleter<gmock_globalmock_sum2> mock_deleter12;
  Matcher<int> local_90;
  Matcher<int> local_78;
  MockSpec<int_(int,_int)> local_60;
  GlobalMockDeleter<gmock_globalmock_sum2> local_18;
  GlobalMockDeleter<gmock_globalmock_sum2> mock_deleter11;
  SummizerTestGlobal2_CanSumGlobal2_Test *this_local;
  
  mock_deleter11.m_mockReference =
       (unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_> *)this;
  GlobalMockDeleter<gmock_globalmock_sum2>::GlobalMockDeleter
            (&local_18,&gmock_globalmock_sum2_instance);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gmock_globalmock_sum2_instance);
  if (bVar1) {
    pgVar7 = std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::
             operator->(&gmock_globalmock_sum2_instance);
    iVar2 = strcmp(pgVar7->m_tag,"TestBody");
    if (iVar2 != 0) goto LAB_00114c64;
  }
  else {
LAB_00114c64:
    pgVar3 = (gmock_globalmock_sum2 *)operator_new(0x50);
    gmock_globalmock_sum2::gmock_globalmock_sum2(pgVar3,"TestBody");
    std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::reset
              (&gmock_globalmock_sum2_instance,pgVar3);
  }
  pgVar4 = std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::
           operator*(&gmock_globalmock_sum2_instance);
  testing::Matcher<int>::Matcher(&local_78,1);
  testing::Matcher<int>::Matcher(&local_90,2);
  gmock_globalmock_sum2::gmock_sum2(&local_60,pgVar4,&local_78,&local_90);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::MockSpec<int_(int,_int)>::operator()
                     (&local_60,(WithoutMatchers *)((long)&mock_deleter12.m_mockReference + 7),
                      (void *)0x0);
  pTVar6 = testing::internal::MockSpec<int_(int,_int)>::InternalExpectedAt
                     (pMVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                      ,0x90,"*gmock_globalmock_sum2_instance","sum2(1, 2)");
  testing::internal::TypedExpectation<int_(int,_int)>::Times(pTVar6,1);
  testing::internal::MockSpec<int_(int,_int)>::~MockSpec(&local_60);
  testing::Matcher<int>::~Matcher(&local_90);
  testing::Matcher<int>::~Matcher(&local_78);
  GlobalMockDeleter<gmock_globalmock_sum2>::GlobalMockDeleter
            (&local_a0,&gmock_globalmock_sum2_instance);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gmock_globalmock_sum2_instance);
  if (bVar1) {
    pgVar7 = std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::
             operator->(&gmock_globalmock_sum2_instance);
    iVar2 = strcmp(pgVar7->m_tag,"TestBody");
    if (iVar2 == 0) goto LAB_00114eb6;
  }
  pgVar3 = (gmock_globalmock_sum2 *)operator_new(0x50);
  gmock_globalmock_sum2::gmock_globalmock_sum2(pgVar3,"TestBody");
  std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::reset
            (&gmock_globalmock_sum2_instance,pgVar3);
LAB_00114eb6:
  pgVar4 = std::unique_ptr<gmock_globalmock_sum2,_std::default_delete<gmock_globalmock_sum2>_>::
           operator*(&gmock_globalmock_sum2_instance);
  testing::Matcher<int>::Matcher(&local_f0,3);
  testing::Matcher<int>::Matcher(&local_108,4);
  gmock_globalmock_sum2::gmock_sum2(&local_d8,pgVar4,&local_f0,&local_108);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::MockSpec<int_(int,_int)>::operator()(&local_d8,&local_109,(void *)0x0)
  ;
  pTVar6 = testing::internal::MockSpec<int_(int,_int)>::InternalExpectedAt
                     (pMVar5,
                      "/workspace/llm4binary/github/license_c_cmakelists/apriorit[P]gmock-global/sample/main.cpp"
                      ,0x91,"*gmock_globalmock_sum2_instance","sum2(3, 4)");
  testing::internal::TypedExpectation<int_(int,_int)>::Times(pTVar6,1);
  testing::internal::MockSpec<int_(int,_int)>::~MockSpec(&local_d8);
  testing::Matcher<int>::~Matcher(&local_108);
  testing::Matcher<int>::~Matcher(&local_f0);
  sum2(1,2);
  sum2(3,4);
  GlobalMockDeleter<gmock_globalmock_sum2>::~GlobalMockDeleter(&local_a0);
  GlobalMockDeleter<gmock_globalmock_sum2>::~GlobalMockDeleter(&local_18);
  return;
}

Assistant:

TEST(SummizerTestGlobal2, CanSumGlobal2)
{
    EXPECT_GLOBAL_CALL(sum2, sum2(1, 2)).Times(1);
    EXPECT_GLOBAL_CALL(sum2, sum2(3, 4)).Times(1);
    sum2(1, 2);
    sum2(3, 4);
}